

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O1

bool TestLowbitsCollisions<unsigned_long>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *revhashes)

{
  pointer puVar1;
  byte bVar2;
  ulong uVar3;
  uint __exponent;
  uint uVar4;
  ulong in_RCX;
  undefined8 uVar5;
  ulong uVar6;
  uint uVar7;
  int in_ESI;
  int nbHashes;
  uint uVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  uint uVar19;
  double in_XMM0_Qa;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  double local_48;
  undefined1 auVar18 [64];
  undefined1 auVar12 [32];
  undefined1 auVar11 [32];
  
  nbHashes = (int)((ulong)((long)(revhashes->
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(revhashes->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_start) >> 3);
  __exponent = FindMinBits_TargetCollisionShare(nbHashes,in_XMM0_Qa);
  uVar4 = FindMaxBits_TargetCollisionNb(nbHashes,in_ESI);
  bVar9 = true;
  if (0xffffffc0 < uVar4 - 0x40) {
    uVar7 = 0;
    printf("Testing collisions (low  %2i-%2i bits) - ",(ulong)__exponent,(ulong)uVar4);
    if ((int)uVar4 < (int)__exponent) {
      dVar21 = 0.0;
      uVar5 = 1;
      uVar8 = 0;
    }
    else {
      auVar23._0_8_ = (double)nbHashes;
      uVar8 = 0;
      dVar21 = 0.0;
      auVar13 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      local_48 = 1.0;
      uVar7 = 0;
      do {
        puVar1 = (revhashes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar6 = (long)(revhashes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
        uVar19 = 0;
        if (1 < uVar6) {
          in_RCX = uVar6 + 6 & 0xfffffffffffffff8;
          auVar14 = vpbroadcastq_avx512f();
          auVar15 = vpbroadcastq_avx512f();
          uVar6 = 0;
          auVar16 = ZEXT1664((undefined1  [16])0x0);
          do {
            auVar24 = auVar16;
            auVar16 = vpbroadcastq_avx512f();
            auVar16 = vporq_avx512f(auVar16,auVar13);
            uVar3 = vpcmpuq_avx512f(auVar16,auVar14,2);
            auVar16 = vmovdqu64_avx512f(*(undefined1 (*) [64])(puVar1 + uVar6));
            bVar2 = (byte)uVar3;
            auVar17._8_8_ = (ulong)((byte)(uVar3 >> 1) & 1) * auVar16._8_8_;
            auVar17._0_8_ = (ulong)(bVar2 & 1) * auVar16._0_8_;
            auVar17._16_8_ = (ulong)((byte)(uVar3 >> 2) & 1) * auVar16._16_8_;
            auVar17._24_8_ = (ulong)((byte)(uVar3 >> 3) & 1) * auVar16._24_8_;
            auVar17._32_8_ = (ulong)((byte)(uVar3 >> 4) & 1) * auVar16._32_8_;
            auVar17._40_8_ = (ulong)((byte)(uVar3 >> 5) & 1) * auVar16._40_8_;
            auVar17._48_8_ = (ulong)((byte)(uVar3 >> 6) & 1) * auVar16._48_8_;
            auVar17._56_8_ = (uVar3 >> 7) * auVar16._56_8_;
            auVar16 = vpsrlvq_avx512f(auVar17,auVar15);
            auVar17 = vmovdqu64_avx512f(*(undefined1 (*) [64])(puVar1 + uVar6 + 1));
            auVar18._8_8_ = (ulong)((byte)(uVar3 >> 1) & 1) * auVar17._8_8_;
            auVar18._0_8_ = (ulong)(bVar2 & 1) * auVar17._0_8_;
            auVar18._16_8_ = (ulong)((byte)(uVar3 >> 2) & 1) * auVar17._16_8_;
            auVar18._24_8_ = (ulong)((byte)(uVar3 >> 3) & 1) * auVar17._24_8_;
            auVar18._32_8_ = (ulong)((byte)(uVar3 >> 4) & 1) * auVar17._32_8_;
            auVar18._40_8_ = (ulong)((byte)(uVar3 >> 5) & 1) * auVar17._40_8_;
            auVar18._48_8_ = (ulong)((byte)(uVar3 >> 6) & 1) * auVar17._48_8_;
            auVar18._56_8_ = (uVar3 >> 7) * auVar17._56_8_;
            auVar17 = vpsrlvq_avx512f(auVar18,auVar15);
            uVar5 = vpcmpeqq_avx512f(auVar16,auVar17);
            auVar11 = vpmovm2d_avx512vl(uVar5);
            auVar11 = vpsubd_avx2(auVar24._0_32_,auVar11);
            uVar6 = uVar6 + 8;
            auVar16 = ZEXT3264(auVar11);
          } while (in_RCX != uVar6);
          auVar11 = vmovdqa32_avx512vl(auVar11);
          auVar10._0_4_ =
               (uint)(bVar2 & 1) * auVar11._0_4_ | (uint)!(bool)(bVar2 & 1) * auVar24._0_4_;
          bVar9 = (bool)((byte)(uVar3 >> 1) & 1);
          auVar10._4_4_ = (uint)bVar9 * auVar11._4_4_ | (uint)!bVar9 * auVar24._4_4_;
          bVar9 = (bool)((byte)(uVar3 >> 2) & 1);
          auVar10._8_4_ = (uint)bVar9 * auVar11._8_4_ | (uint)!bVar9 * auVar24._8_4_;
          bVar9 = (bool)((byte)(uVar3 >> 3) & 1);
          auVar10._12_4_ = (uint)bVar9 * auVar11._12_4_ | (uint)!bVar9 * auVar24._12_4_;
          bVar9 = (bool)((byte)(uVar3 >> 4) & 1);
          auVar12._16_4_ = (uint)bVar9 * auVar11._16_4_ | (uint)!bVar9 * auVar24._16_4_;
          auVar12._0_16_ = auVar10;
          bVar9 = (bool)((byte)(uVar3 >> 5) & 1);
          auVar12._20_4_ = (uint)bVar9 * auVar11._20_4_ | (uint)!bVar9 * auVar24._20_4_;
          bVar9 = (bool)((byte)(uVar3 >> 6) & 1);
          auVar12._24_4_ = (uint)bVar9 * auVar11._24_4_ | (uint)!bVar9 * auVar24._24_4_;
          bVar9 = SUB81(uVar3 >> 7,0);
          auVar12._28_4_ = (uint)bVar9 * auVar11._28_4_ | (uint)!bVar9 * auVar24._28_4_;
          auVar10 = vphaddd_avx(auVar12._16_16_,auVar10);
          auVar10 = vphaddd_avx(auVar10,auVar10);
          auVar10 = vphaddd_avx(auVar10,auVar10);
          uVar19 = auVar10._0_4_;
        }
        dVar20 = ldexp(1.0,__exponent);
        auVar22._0_8_ = (auVar23._0_8_ * (double)(nbHashes + -1)) / dVar20;
        auVar22._8_8_ = 0;
        auVar23._8_8_ = 0;
        auVar10 = vminsd_avx(auVar23,auVar22);
        dVar20 = (double)(int)uVar19 / auVar10._0_8_;
        if (dVar21 < dVar20) {
          uVar8 = uVar19;
          dVar21 = dVar20;
          local_48 = auVar10._0_8_;
          uVar7 = __exponent;
        }
        bVar9 = __exponent != uVar4;
        auVar13 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        __exponent = __exponent + 1;
      } while (bVar9);
      uVar5 = CONCAT44((int)(in_RCX >> 0x20),(int)local_48);
    }
    bVar9 = true;
    printf("Worst is %2i bits: %2i/%2i (%.2fx)",(ulong)uVar7,(ulong)uVar8,uVar5);
    if (2.0 < dVar21) {
      puts(" !!!!!");
      bVar9 = false;
    }
    else {
      putchar(10);
    }
  }
  return bVar9;
}

Assistant:

bool TestLowbitsCollisions ( std::vector<hashtype> & revhashes)
{
  int origBits = sizeof(hashtype) * 8;

  size_t const nbH = revhashes.size();
  int const minBits = FindMinBits_TargetCollisionShare(nbH, 0.01);
  int const maxBits = FindMaxBits_TargetCollisionNb(nbH, 20);
  if (maxBits <= 0 || maxBits >= origBits) return true;

  printf("Testing collisions (low  %2i-%2i bits) - ", minBits, maxBits);
  double maxCollDev = 0.0;
  int maxCollDevBits = 0;
  int maxCollDevNb = 0;
  double maxCollDevExp = 1.0;

  for (int b = minBits; b <= maxBits; b++) {
      int    const nbColls = CountNbCollisions(revhashes, b);
      double const expected = EstimateNbCollisions(nbH, b);
      assert(expected > 0.0);
      double const dev = (double)nbColls / expected;
      if (dev > maxCollDev) {
          maxCollDev = dev;
          maxCollDevBits = b;
          maxCollDevNb = nbColls;
          maxCollDevExp = expected;
      }
  }

  printf("Worst is %2i bits: %2i/%2i (%.2fx)",
        maxCollDevBits, maxCollDevNb, (int)maxCollDevExp, maxCollDev);

  if (maxCollDev > 2.0) {
    printf(" !!!!!\n");
    return false;
  }

  printf("\n");
  return true;
}